

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O0

void AdjustNurbsCurve(ON_NurbsCurve *crv,ON_3dPoint *P0,ON_3dPoint *P1)

{
  bool bVar1;
  int iVar2;
  ON_3dPoint *pOVar3;
  double local_a8;
  double w;
  bool rat;
  int local_44;
  undefined1 local_40 [4];
  int i;
  ON_3dPointArray Points;
  int cvc;
  ON_3dPoint *P1_local;
  ON_3dPoint *P0_local;
  ON_NurbsCurve *crv_local;
  
  iVar2 = (*(crv->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x18])();
  if (iVar2 < 4) {
    ON_NurbsCurve::ClampEnd(crv,2);
    Points.super_ON_SimpleArray<ON_3dPoint>.m_capacity = ON_NurbsCurve::CVCount(crv);
    ON_3dPointArray::ON_3dPointArray
              ((ON_3dPointArray *)local_40,Points.super_ON_SimpleArray<ON_3dPoint>.m_capacity);
    for (local_44 = 0; local_44 < Points.super_ON_SimpleArray<ON_3dPoint>.m_capacity;
        local_44 = local_44 + 1) {
      pOVar3 = ON_SimpleArray<ON_3dPoint>::AppendNew((ON_SimpleArray<ON_3dPoint> *)local_40);
      ON_NurbsCurve::GetCV(crv,local_44,pOVar3);
    }
    bVar1 = AdjustPointListAlongChord((ON_3dPointArray *)local_40,P0,P1);
    if (bVar1) {
      bVar1 = ON_NurbsCurve::IsRational(crv);
      for (local_44 = 0; local_44 < Points.super_ON_SimpleArray<ON_3dPoint>.m_capacity;
          local_44 = local_44 + 1) {
        local_a8 = 1.0;
        if (bVar1) {
          local_a8 = ON_NurbsCurve::Weight(crv,local_44);
          pOVar3 = ON_SimpleArray<ON_3dPoint>::operator[]
                             ((ON_SimpleArray<ON_3dPoint> *)local_40,local_44);
          ON_3dPoint::operator*=(pOVar3,local_a8);
        }
        pOVar3 = ON_SimpleArray<ON_3dPoint>::operator[]
                           ((ON_SimpleArray<ON_3dPoint> *)local_40,local_44);
        ON_NurbsCurve::SetCV(crv,local_44,pOVar3);
        if (bVar1) {
          ON_NurbsCurve::SetWeight(crv,local_44,local_a8);
        }
      }
    }
    else {
      (*(crv->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x39])();
      (*(crv->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x3a])();
    }
    ON_3dPointArray::~ON_3dPointArray((ON_3dPointArray *)local_40);
  }
  return;
}

Assistant:

static void AdjustNurbsCurve(ON_NurbsCurve& crv,
                             const ON_3dPoint& P0, 
                             const ON_3dPoint& P1)

{
  if (crv.Dimension() > 3)
    return;

  crv.ClampEnd(2);
  int cvc = crv.CVCount();
  ON_3dPointArray Points(cvc);
  int i;
  for (i=0; i<cvc; i++)
    crv.GetCV(i, Points.AppendNew());

  if (!AdjustPointListAlongChord(Points, P0, P1)){
    crv.SetStartPoint(P0);
    crv.SetEndPoint(P1);
    return;
  }

  bool rat = crv.IsRational();
  for (i=0; i<cvc; i++){
    double w = 1.0;
    if (rat){
      w = crv.Weight(i);
      Points[i] *= w;
    }
    crv.SetCV(i, Points[i]);
    if (rat)
      crv.SetWeight(i, w);
  }
  
  return;
}